

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::fill_composite_constant
          (CompilerGLSL *this,SPIRConstant *constant,TypeID type_id,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *initializers)

{
  uint uVar1;
  uint32_t uVar2;
  TypedID<(spirv_cross::Types)3> *pTVar3;
  bool bVar4;
  SPIRType *type;
  CompilerError *this_00;
  long lVar5;
  ulong uVar6;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    type_id.id);
  constant->specialization = true;
  bVar4 = Compiler::is_array(&this->super_Compiler,type);
  if ((!bVar4) && (type->basetype != Struct)) {
    bVar4 = Compiler::is_matrix(&this->super_Compiler,type);
    if (bVar4) {
      uVar1 = type->columns;
      (constant->m).columns = uVar1;
      if ((ulong)uVar1 != 0) {
        pTVar3 = (initializers->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
        uVar2 = type->vecsize;
        lVar5 = 0x40;
        uVar6 = 0;
        do {
          (constant->m).id[uVar6].id = pTVar3[uVar6].id;
          *(uint32_t *)((long)(constant->m).c[0].r + lVar5 + -0x10) = uVar2;
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x38;
        } while (uVar1 != uVar6);
      }
    }
    else {
      bVar4 = Compiler::is_vector(&this->super_Compiler,type);
      if (!bVar4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Unexpected scalar in SpecConstantOp CompositeInsert!")
        ;
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar1 = type->vecsize;
      (constant->m).c[0].vecsize = uVar1;
      if ((ulong)uVar1 != 0) {
        pTVar3 = (initializers->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>).ptr;
        uVar6 = 0;
        do {
          (constant->m).c[0].id[uVar6].id = pTVar3[uVar6].id;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
    }
    return;
  }
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
            (&constant->subconstants,initializers);
  return;
}

Assistant:

void CompilerGLSL::fill_composite_constant(SPIRConstant &constant, TypeID type_id,
                                           const SmallVector<ConstantID> &initializers)
{
	auto &type = get<SPIRType>(type_id);
	constant.specialization = true;
	if (is_array(type) || type.basetype == SPIRType::Struct)
	{
		constant.subconstants = initializers;
	}
	else if (is_matrix(type))
	{
		constant.m.columns = type.columns;
		for (uint32_t i = 0; i < type.columns; ++i)
		{
			constant.m.id[i] = initializers[i];
			constant.m.c[i].vecsize = type.vecsize;
		}
	}
	else if (is_vector(type))
	{
		constant.m.c[0].vecsize = type.vecsize;
		for (uint32_t i = 0; i < type.vecsize; ++i)
			constant.m.c[0].id[i] = initializers[i];
	}
	else
		SPIRV_CROSS_THROW("Unexpected scalar in SpecConstantOp CompositeInsert!");
}